

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_exception
          (ConsoleReporter *this,TestCaseException *e)

{
  TestCaseData *pTVar1;
  ostream *poVar2;
  ulong uVar3;
  String *pSVar4;
  char *pcVar5;
  TestCaseData *pTVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  logTestStart(this);
  pTVar1 = this->tc;
  pTVar6 = pTVar1;
  if ((pTVar1->m_file).field_0.buf[0x17] < '\0') {
    pTVar6 = (TestCaseData *)(pTVar1->m_file).field_0.data.ptr;
  }
  pcVar5 = " ";
  (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pTVar6,(ulong)pTVar1->m_line);
  successOrFailColoredStringToStream(this,false,(uint)e->is_crash * 2 + is_check,pcVar5);
  poVar2 = this->s;
  Color::operator<<(poVar2,Red);
  pcVar5 = "test case THREW exception: ";
  if (e->is_crash != false) {
    pcVar5 = "test case CRASHED: ";
  }
  poVar2 = std::operator<<(poVar2,pcVar5);
  Color::operator<<(poVar2,Cyan);
  poVar2 = doctest::operator<<(poVar2,&e->error_string);
  std::operator<<(poVar2,"\n");
  uVar3 = (*(long *)(detail::g_cs + 0x110) - *(long *)(detail::g_cs + 0x108)) / 0x18;
  iVar8 = (int)uVar3;
  if (iVar8 != 0) {
    pSVar4 = IReporter::get_stringified_contexts();
    poVar2 = this->s;
    lVar7 = 0;
    Color::operator<<(poVar2,None);
    std::operator<<(poVar2,"  logged: ");
    pSVar4 = pSVar4 + (uVar3 & 0xffffffff);
    while (pSVar4 = pSVar4 + -1, 0 < iVar8 + (int)lVar7) {
      bVar9 = lVar7 == 0;
      lVar7 = lVar7 + -1;
      pcVar5 = "          ";
      if (bVar9) {
        pcVar5 = "";
      }
      poVar2 = std::operator<<(this->s,pcVar5);
      poVar2 = doctest::operator<<(poVar2,pSVar4);
      std::operator<<(poVar2,"\n");
    }
  }
  poVar2 = std::operator<<(this->s,"\n");
  Color::operator<<(poVar2,None);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            if(tc->m_no_output)
                return;

            logTestStart();

            file_line_to_stream(tc->m_file.c_str(), tc->m_line, " ");
            successOrFailColoredStringToStream(false, e.is_crash ? assertType::is_require :
                                                                   assertType::is_check);
            s << Color::Red << (e.is_crash ? "test case CRASHED: " : "test case THREW exception: ")
              << Color::Cyan << e.error_string << "\n";

            int num_stringified_contexts = get_num_stringified_contexts();
            if(num_stringified_contexts) {
                auto stringified_contexts = get_stringified_contexts();
                s << Color::None << "  logged: ";
                for(int i = num_stringified_contexts; i > 0; --i) {
                    s << (i == num_stringified_contexts ? "" : "          ")
                      << stringified_contexts[i - 1] << "\n";
                }
            }
            s << "\n" << Color::None;
        }